

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_expression.cpp
# Opt level: O1

void __thiscall
duckdb::Transformer::TransformExpressionList
          (Transformer *this,PGList *list,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *result)

{
  pointer *__ptr;
  PGListCell *pPVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  optional_ptr<duckdb_libpgquery::PGNode,_true> target;
  optional_ptr<duckdb::Transformer,_true> local_38;
  anon_union_8_3_7edaf945_for_data local_30;
  
  pPVar1 = list->head;
  if (pPVar1 != (PGListCell *)0x0) {
    do {
      local_30 = pPVar1->data;
      optional_ptr<duckdb_libpgquery::PGNode,_true>::CheckValid
                ((optional_ptr<duckdb_libpgquery::PGNode,_true> *)&stack0xffffffffffffffd0);
      TransformExpression((Transformer *)&stack0xffffffffffffffc8,(PGNode *)this);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)result,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&stack0xffffffffffffffc8);
      if (local_38.ptr != (Transformer *)0x0) {
        (*(code *)(((local_38.ptr)->parent).ptr)->options)();
      }
      pPVar1 = pPVar1->next;
    } while (pPVar1 != (PGListCell *)0x0);
  }
  return;
}

Assistant:

void Transformer::TransformExpressionList(duckdb_libpgquery::PGList &list,
                                          vector<unique_ptr<ParsedExpression>> &result) {
	for (auto node = list.head; node != nullptr; node = node->next) {
		auto target = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);

		auto expr = TransformExpression(*target);
		result.push_back(std::move(expr));
	}
}